

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O0

void tls_thread(void *arg)

{
  void *pvVar1;
  void *eval_b_2;
  void *eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  void *arg_local;
  
  pvVar1 = uv_key_get(&tls_key);
  if (pvVar1 != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xc1,"uv_key_get(&tls_key)","==","NULL",pvVar1,"==",0);
    abort();
  }
  uv_key_set(&tls_key,arg);
  pvVar1 = uv_key_get(&tls_key);
  if (arg != pvVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xc3,"arg","==","uv_key_get(&tls_key)",arg,"==",pvVar1);
    abort();
  }
  uv_key_set(&tls_key,(void *)0x0);
  pvVar1 = uv_key_get(&tls_key);
  if (pvVar1 != (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
            ,0xc5,"uv_key_get(&tls_key)","==","NULL",pvVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT_NULL(uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT_PTR_EQ(arg, uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT_NULL(uv_key_get(&tls_key));
}